

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Steiner.cpp
# Opt level: O3

void __thiscall Steiner::solve(Steiner *this)

{
  int *piVar1;
  pointer pEVar2;
  _Bit_type *p_Var3;
  pointer pEVar4;
  int *piVar5;
  ostream *poVar6;
  long lVar7;
  int iVar8;
  pointer in_RSI;
  longlong lVar10;
  ulong uVar11;
  int iVar12;
  uint uVar9;
  
  buildRSG(this);
  buildMST(this);
  if (gDoplot == true) {
    std::vector<Edge,_std::allocator<Edge>_>::operator=(&this->_init_edges,&this->_edges);
    in_RSI = (pointer)&this->_MST;
    std::vector<int,_std::allocator<int>_>::operator=
              (&this->_init_MST,(vector<int,_std::allocator<int>_> *)in_RSI);
  }
  piVar5 = (this->_MST).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar1 = (this->_MST).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar5 != piVar1) {
    in_RSI = (this->_edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = this->_MST_cost;
    do {
      lVar7 = lVar7 + in_RSI[*piVar5].weight;
      piVar5 = piVar5 + 1;
    } while (piVar5 != piVar1);
    this->_MST_cost = lVar7;
  }
  buildRST(this);
  uVar9 = 4;
  if (this->_init_p < 500) {
    uVar9 = 99 < this->_init_p | 2;
  }
  iVar8 = uVar9 - 1;
  do {
    init(this,(EVP_PKEY_CTX *)in_RSI);
    buildRSG(this);
    buildMST(this);
    buildRST(this);
    iVar8 = iVar8 + -1;
  } while (iVar8 != 0);
  pEVar4 = (this->_newE).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
           super__Vector_impl_data._M_start;
  pEVar2 = (this->_newE).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pEVar4 != pEVar2) {
    lVar7 = this->_MRST_cost;
    do {
      lVar7 = lVar7 + pEVar4->weight;
      pEVar4 = pEVar4 + 1;
    } while (pEVar4 != pEVar2);
    this->_MRST_cost = lVar7;
  }
  piVar5 = (this->_MST).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar1 = (this->_MST).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar5 != piVar1) {
    pEVar4 = (this->_edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
             super__Vector_impl_data._M_start;
    p_Var3 = (this->_edges_del).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    lVar10 = this->_MRST_cost;
    do {
      iVar8 = *piVar5;
      uVar11 = (ulong)iVar8;
      iVar12 = iVar8 + 0x3f;
      if (-1 < (long)uVar11) {
        iVar12 = iVar8;
      }
      if ((p_Var3[(long)(iVar12 >> 6) +
                  (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff]
           >> (uVar11 & 0x3f) & 1) == 0) {
        lVar10 = lVar10 + pEVar4[uVar11].weight;
        this->_MRST_cost = lVar10;
      }
      piVar5 = piVar5 + 1;
    } while (piVar5 != piVar1);
  }
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(this->_name)._M_dataplus._M_p,
                      (this->_name)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"RSG edge   : ",0xd);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"MST length : ",0xd);
  poVar6 = std::ostream::_M_insert<long_long>((longlong)&std::cerr);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"MRST length: ",0xd);
  poVar6 = std::ostream::_M_insert<long_long>((longlong)&std::cerr);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Improvement: ",0xd);
  poVar6 = std::ostream::_M_insert<double>
                     (((double)(this->_MST_cost - this->_MRST_cost) / (double)this->_MST_cost) *
                      100.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"%",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  return;
}

Assistant:

void Steiner::solve() {
#ifdef VERBOSE
  TimeUsage timer;
#endif
  buildRSG();
#ifdef VERBOSE
  timer.showUsage("buildRSG", TimeUsage::PARTIAL);
  timer.start(TimeUsage::PARTIAL);
#endif
  buildMST();
#ifdef VERBOSE
  timer.showUsage("buildMST", TimeUsage::PARTIAL);
  timer.start(TimeUsage::PARTIAL);
#endif
  if (gDoplot) {
    _init_edges = _edges;
    _init_MST = _MST;
  }
  for (int eId : _MST) _MST_cost += _edges[eId].weight;
  buildRST();
#ifdef VERBOSE
  timer.showUsage("buildRST", TimeUsage::PARTIAL);
  timer.start(TimeUsage::PARTIAL);
#endif
  unsigned numIter = 2;
  if (_init_p >= 10) numIter = 2;
  if (_init_p >= 100) numIter = 3;
  if (_init_p >= 500) numIter = 4;
  for (unsigned iter = 1; iter < numIter; ++iter) {
    init();
    buildRSG();
#ifdef VERBOSE
  timer.showUsage("buildRSG", TimeUsage::PARTIAL);
  timer.start(TimeUsage::PARTIAL);
#endif
    buildMST();
#ifdef VERBOSE
  timer.showUsage("buildMST", TimeUsage::PARTIAL);
  timer.start(TimeUsage::PARTIAL);
#endif
    buildRST();
#ifdef VERBOSE
  timer.showUsage("buildRST", TimeUsage::PARTIAL);
  timer.start(TimeUsage::PARTIAL);
#endif
  }
  for (auto& e : _newE) _MRST_cost += e.weight;
  for (int eId : _MST) {
    if (_edges_del[eId]) continue;
    _MRST_cost += _edges[eId].weight;
  }
  cerr << _name << endl;
  cerr << "RSG edge   : " << _edges.size() << endl;
  cerr << "MST length : " << _MST_cost << endl;
  cerr << "MRST length: " << _MRST_cost << endl;
  cerr << "Improvement: "
       << (double)(_MST_cost - _MRST_cost) / _MST_cost * 100
       << "%" << endl;
}